

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O2

void __thiscall
OpenMD::RNEMD::SPFMethod::SPFMethod(SPFMethod *this,SimInfo *info,ForceManager *forceMan)

{
  SelectionEvaluator *this_00;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  RNEMDFluxType RVar5;
  pointer ppMVar6;
  RealType RVar7;
  double dVar8;
  SimInfo *info_00;
  SPFForceManager *pSVar9;
  Molecule *this_01;
  long lVar10;
  RNEMDParameters *pRVar11;
  SelectionManager *this_02;
  size_t i_1;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  MoleculeIterator i;
  vector<double,_std::allocator<double>_> q_tot;
  vector<int,_std::allocator<int>_> molCount;
  string ionStr;
  SelectionManager ionManager;
  SelectionEvaluator ionEvaluator;
  MoleculeIterator local_6e0;
  RNEMDParameters *local_6d8;
  SelectionManager *local_6d0;
  SelectionManager *local_6c8;
  SimInfo *local_6c0;
  _Vector_base<double,_std::allocator<double>_> local_6b8;
  _Vector_base<int,_std::allocator<int>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  SelectionManager local_648;
  SelectionEvaluator local_580;
  
  RNEMD::RNEMD(&this->super_RNEMD,info,forceMan);
  (this->super_RNEMD)._vptr_RNEMD = (_func_int **)&PTR__SPFMethod_002c19a8;
  this->spfTarget_ = 0.0;
  local_6c8 = &this->smanA_;
  SelectionManager::SelectionManager(local_6c8,info);
  local_6d0 = &this->smanB_;
  SelectionManager::SelectionManager(local_6d0,info);
  SelectionManager::SelectionManager(&this->anionMan_,info);
  SelectionManager::SelectionManager(&this->cationMan_,info);
  this->forceManager_ = (SPFForceManager *)0x0;
  (this->selectedMoleculeStr_)._M_dataplus._M_p = (pointer)&(this->selectedMoleculeStr_).field_2;
  (this->selectedMoleculeStr_)._M_string_length = 0;
  (this->selectedMoleculeStr_).field_2._M_local_buf[0] = '\0';
  this_00 = &this->selectedMoleculeEvaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  SelectionManager::SelectionManager(&this->selectedMoleculeMan_,info);
  this->failedLastTrial_ = false;
  std::__cxx11::string::assign((char *)&(this->super_RNEMD).rnemdMethodLabel_);
  std::__cxx11::string::assign((char *)&this->selectedMoleculeStr_);
  SelectionEvaluator::loadScriptString(this_00,&this->selectedMoleculeStr_);
  SelectionEvaluator::evaluate((SelectionSet *)&local_580,this_00);
  SelectionManager::setSelectionSet(&this->selectedMoleculeMan_,(SelectionSet *)&local_580);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_580);
  if ((forceMan == (ForceManager *)0x0) ||
     (pSVar9 = (SPFForceManager *)
               __dynamic_cast(forceMan,&ForceManager::typeinfo,&SPFForceManager::typeinfo,0),
     pSVar9 == (SPFForceManager *)0x0)) {
    builtin_strncpy(painCave.errMsg + 0x30,"anager.\n",9);
    builtin_strncpy(painCave.errMsg + 0x20,"e default ForceM",0x10);
    builtin_strncpy(painCave.errMsg + 0x10," be used with th",0x10);
    builtin_strncpy(painCave.errMsg,"SPF-RNEMD cannot",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->forceManager_ = pSVar9;
    pSVar9->spfRNEMD_ = this;
  }
  pRVar11 = info->simParams_->rnemdPars_;
  if ((this->super_RNEMD).useChargedSPF_ == true) {
    local_6e0._M_node = (_Base_ptr)0x0;
    local_6d8 = pRVar11;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_6b8,
               (long)(this->super_RNEMD).objectTypes_.
                     super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_RNEMD).objectTypes_.
                     super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_580);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_6a0,
               (long)(this->super_RNEMD).objectTypes_.
                     super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_RNEMD).objectTypes_.
                     super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_580);
    this_01 = SimInfo::beginMolecule((this->super_RNEMD).info_,&local_6e0);
    while (this_01 != (Molecule *)0x0) {
      for (uVar12 = 0;
          ppMVar6 = (this->super_RNEMD).objectTypes_.
                    super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(this->super_RNEMD).objectTypes_.
                                 super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3);
          uVar12 = uVar12 + 1) {
        if (ppMVar6[uVar12] == this_01->molStamp_) {
          RVar7 = Molecule::getFixedCharge(this_01);
          local_6b8._M_impl.super__Vector_impl_data._M_start[uVar12] =
               RVar7 + local_6b8._M_impl.super__Vector_impl_data._M_start[uVar12];
          local_6a0._M_impl.super__Vector_impl_data._M_start[uVar12] =
               local_6a0._M_impl.super__Vector_impl_data._M_start[uVar12] + 1;
        }
      }
      this_01 = SimInfo::nextMolecule((this->super_RNEMD).info_,&local_6e0);
    }
    local_6c0 = info;
    for (uVar12 = 0; info_00 = local_6c0,
        uVar12 < (ulong)((long)(this->super_RNEMD).objectTypes_.
                               super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_RNEMD).objectTypes_.
                               super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1)
    {
      SelectionEvaluator::SelectionEvaluator(&local_580,local_6c0);
      SelectionManager::SelectionManager(&local_648,info_00);
      std::__cxx11::string::string
                ((string *)&local_688,
                 (string *)
                 &((this->super_RNEMD).objectTypes_.
                   super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12]->Name).data_);
      std::operator+(&local_668,"select ",&local_688);
      std::__cxx11::string::~string((string *)&local_688);
      SelectionEvaluator::loadScriptString(&local_580,&local_668);
      SelectionEvaluator::evaluate((SelectionSet *)&local_688,&local_580);
      SelectionManager::setSelectionSet(&local_648,(SelectionSet *)&local_688);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_688);
      if (local_6a0._M_impl.super__Vector_impl_data._M_start[uVar12] < 1) {
        local_6b8._M_impl.super__Vector_impl_data._M_start[uVar12] = 0.0;
      }
      else {
        dVar8 = local_6b8._M_impl.super__Vector_impl_data._M_start[uVar12] /
                (double)local_6a0._M_impl.super__Vector_impl_data._M_start[uVar12];
        local_6b8._M_impl.super__Vector_impl_data._M_start[uVar12] = dVar8;
        this_02 = &this->cationMan_;
        if ((0.0 < dVar8) || (this_02 = &this->anionMan_, dVar8 < 0.0)) {
          SelectionManager::operator|=(this_02,&local_648);
        }
      }
      std::__cxx11::string::~string((string *)&local_668);
      SelectionManager::~SelectionManager(&local_648);
      SelectionEvaluator::~SelectionEvaluator(&local_580);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_6a0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_6b8);
    pRVar11 = local_6d8;
  }
  bVar2 = (pRVar11->KineticFlux).super_ParameterBase.empty_;
  bVar3 = (pRVar11->ParticleFlux).super_ParameterBase.empty_;
  bVar4 = (pRVar11->CurrentDensity).super_ParameterBase.empty_;
  RVar5 = (this->super_RNEMD).rnemdFluxType_;
  if (RVar5 == rnemdParticle) {
    lVar10 = 0x278;
    if (bVar3 != false) goto LAB_0022785f;
  }
  else {
    if (RVar5 == rnemdCurrentDensity) {
      if (bVar4 != false) goto LAB_0022785f;
      lVar10 = 0x278;
      if (bVar3 == false) goto LAB_002278b1;
    }
    else {
      if (RVar5 == rnemdParticleKE) {
        if (bVar3 != false || bVar2 != false) goto LAB_0022785f;
      }
      else {
        snprintf(painCave.errMsg,2000,
                 "RNEMD: The current method, SPF\n\tcannot be used with the current flux type, %s\n"
                 ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
LAB_0022785f:
        snprintf(painCave.errMsg,2000,
                 "RNEMD: The current method, SPF, and flux type, %s,\n\tdid not have the correct flux type specified. Options\n\tinclude: particleFlux, particleFlux + kineticFlux,\n\tand currentDensity.\n"
                 ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      lVar10 = 0x278;
      if (bVar3 == false) goto LAB_002278b1;
      uVar13 = 0;
      uVar14 = 0;
      if (bVar4 != false) goto LAB_002278b8;
    }
    lVar10 = 0x2b0;
  }
LAB_002278b1:
  uVar1 = *(undefined8 *)((long)&(pRVar11->super_DataHolder)._vptr_DataHolder + lVar10);
  uVar13 = (undefined4)uVar1;
  uVar14 = (undefined4)((ulong)uVar1 >> 0x20);
LAB_002278b8:
  RNEMD::setParticleFlux(&this->super_RNEMD,(RealType)CONCAT44(uVar14,uVar13));
  uVar13 = 0;
  uVar14 = 0;
  if (bVar2 == false) {
    dVar8 = (pRVar11->KineticFlux).data_;
    uVar13 = SUB84(dVar8,0);
    uVar14 = (undefined4)((ulong)dVar8 >> 0x20);
  }
  RNEMD::setKineticFlux(&this->super_RNEMD,(RealType)CONCAT44(uVar14,uVar13));
  this->uniformKineticScaling_ =
       (bool)(pRVar11->SPFUniformKineticScaling).super_ParameterBase.field_0x2b;
  return;
}

Assistant:

SPFMethod::SPFMethod(SimInfo* info, ForceManager* forceMan) :
      RNEMD {info, forceMan}, smanA_ {info}, smanB_ {info}, anionMan_ {info},
      cationMan_ {info}, selectedMoleculeMan_ {info},
      selectedMoleculeEvaluator_ {info} {
    rnemdMethodLabel_ = "SPF";

    selectedMoleculeStr_ = "select none";
    selectedMoleculeEvaluator_.loadScriptString(selectedMoleculeStr_);
    selectedMoleculeMan_.setSelectionSet(selectedMoleculeEvaluator_.evaluate());

    if (SPFForceManager* spfForceManager =
            dynamic_cast<SPFForceManager*>(forceMan)) {
      forceManager_            = spfForceManager;
      forceManager_->spfRNEMD_ = this;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SPF-RNEMD cannot be used with the default ForceManager.\n");
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    RNEMDParameters* rnemdParams = info->getSimParams()->getRNEMDParameters();

    // Calculate ion fixed charges for use in the Charged-SPF method
    if (useChargedSPF_) {
      SimInfo::MoleculeIterator i;
      Molecule* mol;
      std::vector<RealType> q_tot(objectTypes_.size());
      std::vector<int> molCount(objectTypes_.size());

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (std::size_t i {}; i < objectTypes_.size(); ++i) {
          if (objectTypes_[i] == mol->getMolStamp()) {
            q_tot[i] += mol->getFixedCharge();
            molCount[i]++;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &q_tot[0], q_tot.size(), MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &molCount[0], molCount.size(), MPI_INT,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      for (std::size_t i {}; i < objectTypes_.size(); ++i) {
        SelectionEvaluator ionEvaluator {info};
        SelectionManager ionManager {info};

        std::string ionStr = "select " + objectTypes_[i]->getName();
        ionEvaluator.loadScriptString(ionStr);
        ionManager.setSelectionSet(ionEvaluator.evaluate());

        if (molCount[i] > 0) {
          q_tot[i] /= molCount[i];

          if (q_tot[i] > 0.0) {
            cationMan_ |= ionManager;
          } else if (q_tot[i] < 0.0) {
            anionMan_ |= ionManager;
          }
        } else {
          q_tot[i] = 0.0;
        }
      }
    }

    bool hasParticleFlux   = rnemdParams->haveParticleFlux();
    bool hasCurrentDensity = rnemdParams->haveCurrentDensity();
    bool hasKineticFlux    = rnemdParams->haveKineticFlux();

    bool methodFluxMismatch = false;
    bool hasCorrectFlux     = false;

    switch (rnemdFluxType_) {
    case rnemdParticle:
      hasCorrectFlux = hasParticleFlux;
      break;
    case rnemdParticleKE:
      hasCorrectFlux = hasParticleFlux && hasKineticFlux;
      break;
    case rnemdCurrentDensity:
      hasCorrectFlux = hasCurrentDensity;
      break;
    default:
      methodFluxMismatch = true;
      break;
    }

    if (methodFluxMismatch) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, SPF\n"
               "\tcannot be used with the current flux type, %s\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (!hasCorrectFlux) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, SPF, and flux type, %s,\n"
               "\tdid not have the correct flux type specified. Options\n"
               "\tinclude: particleFlux, particleFlux + kineticFlux,\n"
               "\tand currentDensity.\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (hasParticleFlux) {
      setParticleFlux(rnemdParams->getParticleFlux());
    } else if (hasCurrentDensity) {
      setParticleFlux(rnemdParams->getCurrentDensity());
    } else {
      setParticleFlux(0.0);
    }

    if (hasKineticFlux) {
      setKineticFlux(rnemdParams->getKineticFlux());
    } else {
      setKineticFlux(0.0);
    }

    uniformKineticScaling_ = rnemdParams->getSPFUniformKineticScaling();
  }